

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_load.c
# Opt level: O1

int lua_dump(lua_State *L,lua_Writer writer,void *data)

{
  int iVar1;
  ulong uVar2;
  
  if ((L->top[-1].field_4.it >> 0xf == 0x1fff7) &&
     (uVar2 = (ulong)L->top[-1].field_4 & 0x7fffffffffff, *(char *)(uVar2 + 10) == '\0')) {
    iVar1 = lj_bcwrite(L,(GCproto *)(*(long *)(uVar2 + 0x20) + -0x68),writer,data,0);
    return iVar1;
  }
  return 1;
}

Assistant:

LUA_API int lua_dump(lua_State *L, lua_Writer writer, void *data)
{
  cTValue *o = L->top-1;
  lj_checkapi(L->top > L->base, "top slot empty");
  if (tvisfunc(o) && isluafunc(funcV(o)))
    return lj_bcwrite(L, funcproto(funcV(o)), writer, data, 0);
  else
    return 1;
}